

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O3

void __thiscall pstore::file::file_handle::~file_handle(file_handle *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  error_or<int> local_20;
  
  this->is_writable_ = false;
  close_noex(&local_20,this->file_);
  if (local_20.has_error_ == false) {
    error_or<int>::value_storage_impl<pstore::error_or<int>&,int>(&local_20);
  }
  else {
    error_or<int>::error_storage_impl<pstore::error_or<int>&,std::error_code>(&local_20);
  }
  this->file_ = -1;
  pcVar1 = (this->path_)._M_dataplus._M_p;
  paVar2 = &(this->path_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

file_handle::~file_handle () noexcept {
            is_writable_ = false;
            file_handle::close_noex (file_);
            file_ = invalid_oshandle;
        }